

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particles.c
# Opt level: O1

int physics_thread_main(void *arg)

{
  float fVar1;
  double dVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  float dt;
  float fVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  timespec ts;
  timespec local_40;
  
  do {
    mtx_lock(&thread_sync.particles_lock);
    while ((iVar3 = glfwWindowShouldClose((GLFWwindow *)arg), iVar3 == 0 &&
           (thread_sync.d_frame < thread_sync.p_frame))) {
      clock_gettime(0,&local_40);
      lVar5 = (local_40.tv_nsec + 100000000) / 1000000000;
      local_40.tv_sec = local_40.tv_sec + lVar5;
      local_40.tv_nsec = lVar5 * -1000000000 + local_40.tv_nsec + 100000000;
      cnd_timedwait(&thread_sync.d_done,&thread_sync.particles_lock,(timespec *)&local_40);
    }
    iVar3 = glfwWindowShouldClose((GLFWwindow *)arg);
    dVar2 = thread_sync.t;
    fVar1 = thread_sync.dt;
    if (iVar3 != 0) {
      return 0;
    }
    for (; 0.0 < fVar1; fVar1 = fVar1 - dt) {
      dt = fVar1;
      if (0.0013333333 <= fVar1) {
        dt = 0.0013333333;
      }
      lVar5 = 0;
      do {
        update_particle((PARTICLE *)((long)&particles[0].x + lVar5),dt);
        lVar5 = lVar5 + 0x2c;
      } while (lVar5 != 0x203a0);
      min_age = min_age + dt;
LAB_00116f53:
      if (0.0026666666 <= min_age) {
        min_age = min_age + -0.0026666666;
        lVar5 = 0;
        do {
          if (*(int *)((long)&particles[0].active + lVar5) == 0) {
            dVar7 = (double)min_age + dVar2;
            *(undefined8 *)((long)&particles[0].x + lVar5) = 0;
            *(undefined4 *)((long)&particles[0].z + lVar5) = 0x40400000;
            uVar4 = rand();
            *(float *)((long)&particles[0].vz + lVar5) = (float)(uVar4 & 0xfff) * 7.324219e-05 + 0.7
            ;
            uVar4 = rand();
            dVar8 = (double)((float)(uVar4 & 0xfff) * 0.0015339808);
            dVar9 = cos(dVar8);
            *(float *)((long)&particles[0].vx + lVar5) = (float)dVar9 * 0.4;
            dVar8 = sin(dVar8);
            *(float *)((long)&particles[0].vy + lVar5) = (float)dVar8 * 0.4;
            dVar8 = sin(dVar7 * 0.5);
            dVar9 = sin(dVar7 * 1.31);
            fVar6 = ((float)(dVar9 + dVar8) * 0.1 + 0.8) * 8.0;
            *(float *)((long)&particles[0].vx + lVar5) =
                 *(float *)((long)&particles[0].vx + lVar5) * fVar6;
            *(float *)((long)&particles[0].vy + lVar5) =
                 *(float *)((long)&particles[0].vy + lVar5) * fVar6;
            *(float *)((long)&particles[0].vz + lVar5) =
                 fVar6 * *(float *)((long)&particles[0].vz + lVar5);
            dVar8 = sin(dVar7 * 0.34 + 0.1);
            *(float *)((long)&particles[0].r + lVar5) = (float)dVar8 * 0.3 + 0.7;
            dVar8 = sin(dVar7 * 0.63 + 1.1);
            *(float *)((long)&particles[0].g + lVar5) = (float)dVar8 * 0.4 + 0.6;
            dVar8 = sin(dVar7 * 0.91 + 2.1);
            *(float *)((long)&particles[0].b + lVar5) = (float)dVar8 * 0.4 + 0.6;
            dVar8 = sin(dVar7 * 1.34);
            glow_pos[0] = (float)dVar8 * 0.4;
            dVar7 = sin(dVar7 * 3.11);
            glow_pos[1] = (float)dVar7 * 0.4;
            glow_pos[2] = 4.0;
            glow_pos[3] = 1.0;
            glow_color[0] = *(float *)((long)&particles[0].r + lVar5);
            glow_color._4_8_ = *(undefined8 *)((long)&particles[0].g + lVar5);
            glow_color[3] = 1.0;
            *(undefined8 *)((long)&particles[0].life + lVar5) = 0x13f800000;
            update_particle((PARTICLE *)((long)&particles[0].x + lVar5),min_age);
            break;
          }
          lVar5 = lVar5 + 0x2c;
        } while (lVar5 != 0x203a0);
        goto LAB_00116f53;
      }
    }
    thread_sync.p_frame = thread_sync.p_frame + 1;
    mtx_unlock(&thread_sync.particles_lock);
    cnd_signal(&thread_sync.p_done);
  } while( true );
}

Assistant:

static int physics_thread_main(void* arg)
{
    GLFWwindow* window = arg;

    for (;;)
    {
        mtx_lock(&thread_sync.particles_lock);

        // Wait for particle drawing to be done
        while (!glfwWindowShouldClose(window) &&
               thread_sync.p_frame > thread_sync.d_frame)
        {
            struct timespec ts;
            clock_gettime(CLOCK_REALTIME, &ts);
            ts.tv_nsec += 100 * 1000 * 1000;
            ts.tv_sec += ts.tv_nsec / (1000 * 1000 * 1000);
            ts.tv_nsec %= 1000 * 1000 * 1000;
            cnd_timedwait(&thread_sync.d_done, &thread_sync.particles_lock, &ts);
        }

        if (glfwWindowShouldClose(window))
            break;

        // Update particles
        particle_engine(thread_sync.t, thread_sync.dt);

        // Update frame counter
        thread_sync.p_frame++;

        // Unlock mutex and signal drawing thread
        mtx_unlock(&thread_sync.particles_lock);
        cnd_signal(&thread_sync.p_done);
    }

    return 0;
}